

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::outputrows(aalcalc *this,char *buffer,int strLen,FILE *fout)

{
  FILE *__stream;
  uint uVar1;
  int *piVar2;
  char *pcVar3;
  int iVar4;
  
  iVar4 = 1;
  pcVar3 = buffer;
  do {
    uVar1 = fprintf((FILE *)fout,"%s",pcVar3);
    __stream = _stderr;
    if ((int)uVar1 < 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(__stream,"FATAL: Error writing %s: %s\n",buffer,pcVar3);
      goto LAB_0010416e;
    }
    if (strLen - uVar1 == 0 || strLen < (int)uVar1) {
      return;
    }
    pcVar3 = pcVar3 + uVar1;
    fprintf(_stderr,"INFO: Attempt %d to write %s\n",iVar4,buffer);
    iVar4 = iVar4 + 1;
    strLen = strLen - uVar1;
  } while (iVar4 != 0xb);
  fprintf(_stderr,"FATAL: Maximum attempts to write %s exceeded\n",buffer);
LAB_0010416e:
  exit(1);
}

Assistant:

inline void aalcalc::outputrows(const char * buffer, int strLen, FILE * fout) {

	const char * bufPtr = buffer;
	int num;
	int counter = 0;
	do {

		num = fprintf(fout, "%s", bufPtr);
		if (num < 0) {   // Write error
			fprintf(stderr, "FATAL: Error writing %s: %s\n",
				buffer, strerror(errno));
			exit(EXIT_FAILURE);
		} else if (num < strLen) {   // Incomplete write
			bufPtr += num;
			strLen -= num;
		} else return;   // Success

		fprintf(stderr, "INFO: Attempt %d to write %s\n", ++counter,
			buffer);

	} while (counter < 10);

	fprintf(stderr, "FATAL: Maximum attempts to write %s exceeded\n",
		buffer);
	exit(EXIT_FAILURE);

}